

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O2

ostream * embree::operator<<(ostream *cout,Token *t)

{
  ostream *poVar1;
  char *pcVar2;
  
  switch(t->ty) {
  case TY_EOF:
    pcVar2 = "eof";
    goto LAB_00196586;
  case TY_CHAR:
    poVar1 = std::operator<<(cout,"Char(");
    cout = std::operator<<(poVar1,(t->field_1).c);
    break;
  case TY_INT:
    poVar1 = std::operator<<(cout,"Int(");
    cout = (ostream *)std::ostream::operator<<(poVar1,(t->field_1).i);
    break;
  case TY_FLOAT:
    poVar1 = std::operator<<(cout,"Float(");
    cout = (ostream *)std::ostream::operator<<(poVar1,(t->field_1).f);
    break;
  case TY_IDENTIFIER:
    pcVar2 = "Id(";
    goto LAB_00196568;
  case TY_STRING:
    pcVar2 = "String(";
    goto LAB_00196568;
  case TY_SYMBOL:
    pcVar2 = "Symbol(";
LAB_00196568:
    poVar1 = std::operator<<(cout,pcVar2);
    cout = std::operator<<(poVar1,(string *)&t->str);
    break;
  default:
    pcVar2 = "unknown";
    goto LAB_00196586;
  }
  pcVar2 = ")";
LAB_00196586:
  poVar1 = std::operator<<(cout,pcVar2);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& cout, const Token& t)
    {
      if (t.ty == TY_EOF) return cout << "eof";
      if (t.ty == TY_CHAR) return cout << "Char(" << t.c << ")";
      if (t.ty == TY_INT) return cout << "Int(" << t.i << ")";
      if (t.ty == TY_FLOAT) return cout << "Float(" << t.f << ")";
      if (t.ty == TY_IDENTIFIER) return cout << "Id(" << t.str << ")";
      if (t.ty == TY_STRING) return cout << "String(" << t.str << ")";
      if (t.ty == TY_SYMBOL) return cout << "Symbol(" << t.str << ")";
      return cout << "unknown";
    }